

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> * __thiscall
Line::generate_option
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Line *this,
          vector<int,_std::allocator<int>_> *position_indexes,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *possible_per_number)

{
  pointer piVar1;
  pointer pvVar2;
  pointer piVar3;
  _Bvector_impl *p_Var4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  vector<bool,_std::allocator<bool>_> option;
  allocator_type local_52;
  bool local_51;
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_51 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,(ulong)this->m_size,&local_51,&local_52);
  piVar1 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    pvVar2 = (possible_per_number->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (position_indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      lVar8 = (long)piVar1[lVar7];
      if (0 < lVar8) {
        uVar5 = (ulong)*(int *)(*(long *)&pvVar2[lVar7].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + (long)piVar3[lVar7] * 4);
        do {
          uVar9 = uVar5 + 0x3f;
          if (-1 < (long)uVar5) {
            uVar9 = uVar5;
          }
          local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar9 >> 6) + ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar9 >> 6) +
                ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar5 & 0x3f);
          uVar5 = uVar5 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6 + (ulong)(lVar6 == 0));
  }
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var4 = &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  p_Var4 = &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  (p_Var4->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var4->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc =
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._12_4_;
  return __return_storage_ptr__;
}

Assistant:

vector<bool>
Line::generate_option(const vector<int> &position_indexes, const vector<vector<int>> &possible_per_number) const {
    vector<bool> option(m_size, false);

    for (int i = 0; i < m_numbers.size(); i++) {
        for (int j = 0; j < m_numbers[i]; j++) option[possible_per_number[i][position_indexes[i]] + j] = true;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    for (auto &&tile : option) {
        output << (tile ? '1' : '0');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    return move(option);
}